

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::RecyclableObjectWalker::InsertItem
          (RecyclableObjectWalker *this,PropertyId propertyId,bool isConst,bool isUnscoped,
          Var itemObj,RecyclableMethodsGroupWalker **ppMethodsGroupWalker,bool shouldPinProperty)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptLibrary *this_00;
  DebugContext *this_01;
  ProbeContainer *this_02;
  ThreadContext *this_03;
  DebugManager *this_04;
  DebuggerPropertyDisplayInfo *pDVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  RecyclableMethodsGroupWalker *this_05;
  TrackAllocData local_110;
  DebuggerPropertyDisplayInfo *local_e8;
  DebuggerPropertyDisplayInfo *info_1;
  RecyclableMethodsGroupWalker *pRStack_d8;
  DWORD flags;
  code *local_d0;
  undefined8 local_c8;
  TrackAllocData local_c0;
  code *local_98;
  undefined8 local_90;
  TrackAllocData local_88;
  DebuggerPropertyDisplayInfo *local_60;
  DebuggerPropertyDisplayInfo *info;
  ArenaAllocator *arena;
  PropertyRecord *propertyRecord;
  RecyclableMethodsGroupWalker **ppRStack_40;
  bool shouldPinProperty_local;
  RecyclableMethodsGroupWalker **ppMethodsGroupWalker_local;
  Var itemObj_local;
  bool isUnscoped_local;
  bool isConst_local;
  RecyclableObjectWalker *pRStack_28;
  PropertyId propertyId_local;
  RecyclableObjectWalker *this_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  propertyRecord._7_1_ = shouldPinProperty;
  ppRStack_40 = ppMethodsGroupWalker;
  ppMethodsGroupWalker_local = (RecyclableMethodsGroupWalker **)itemObj;
  itemObj_local._2_1_ = isUnscoped;
  itemObj_local._3_1_ = isConst;
  itemObj_local._4_4_ = propertyId;
  pRStack_28 = this;
  if (propertyId == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa9b,"(propertyId)","propertyId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (ppRStack_40 == (RecyclableMethodsGroupWalker **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa9c,"(ppMethodsGroupWalker)","ppMethodsGroupWalker");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (ppMethodsGroupWalker_local == (RecyclableMethodsGroupWalker **)0x0) {
    this_00 = ScriptContext::GetLibrary(this->scriptContext);
    ppMethodsGroupWalker_local =
         (RecyclableMethodsGroupWalker **)
         JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  }
  if (((propertyRecord._7_1_ & 1) != 0) &&
     (arena = (ArenaAllocator *)
              ScriptContext::GetPropertyName(this->scriptContext,itemObj_local._4_4_),
     (PropertyRecord *)arena != (PropertyRecord *)0x0)) {
    this_01 = ScriptContext::GetDebugContext(this->scriptContext);
    this_02 = DebugContext::GetProbeContainer(this_01);
    Js::ProbeContainer::PinPropertyRecord(this_02,(PropertyRecord *)arena);
  }
  info = (DebuggerPropertyDisplayInfo *)GetArenaFromContext(this->scriptContext);
  this_local = (RecyclableObjectWalker *)ppMethodsGroupWalker_local;
  if (ppMethodsGroupWalker_local == (RecyclableMethodsGroupWalker **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(this_local);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(this_local);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(this_local);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if ((0x57 < (int)local_14) && (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_18 = local_14;
    }
  }
  pDVar5 = info;
  if (local_18 == TypeIds_Function) {
    this_03 = ScriptContext::GetThreadContext(this->scriptContext);
    this_04 = ThreadContext::GetDebugManager(this_03);
    bVar2 = DebugManager::IsLocalsDisplayFlagsSet(this_04,LocalsDisplayFlags_NoGroupMethods);
    pDVar5 = info;
    if (bVar2) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_88,(type_info *)&DebuggerPropertyDisplayInfo::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                 ,0xab3);
      pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pDVar5,&local_88);
      local_98 = Memory::ArenaAllocator::Alloc;
      local_90 = 0;
      pDVar5 = (DebuggerPropertyDisplayInfo *)
               new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar6,0x3f67b0);
      DebuggerPropertyDisplayInfo::DebuggerPropertyDisplayInfo
                (pDVar5,itemObj_local._4_4_,ppMethodsGroupWalker_local,1);
      local_60 = pDVar5;
      JsUtil::
      List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(this->pMembersList,&local_60);
    }
    else {
      EnsureFakeGroupObjectWalkerList(this);
      pDVar5 = info;
      if (*ppRStack_40 == (RecyclableMethodsGroupWalker *)0x0) {
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_c0,(type_info *)&RecyclableMethodsGroupWalker::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                   ,0xabc);
        pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)pDVar5,&local_c0);
        local_d0 = Memory::ArenaAllocator::Alloc;
        local_c8 = 0;
        this_05 = (RecyclableMethodsGroupWalker *)
                  new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar6,0x3f67b0);
        RecyclableMethodsGroupWalker::RecyclableMethodsGroupWalker
                  (this_05,this->scriptContext,this->instance);
        *ppRStack_40 = this_05;
        pRStack_d8 = *ppRStack_40;
        JsUtil::
        List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::Add(this->fakeGroupObjectWalkerList,
              (IDiagObjectModelWalkerBase **)&stack0xffffffffffffff28);
      }
      RecyclableMethodsGroupWalker::AddItem
                (*ppRStack_40,itemObj_local._4_4_,ppMethodsGroupWalker_local);
    }
  }
  else {
    info_1._4_4_ = itemObj_local._3_1_ & 1 | (itemObj_local._2_1_ & 1) << 2;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_110,(type_info *)&DebuggerPropertyDisplayInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xac9);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pDVar5,&local_110);
    pDVar5 = (DebuggerPropertyDisplayInfo *)
             new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar6,0x3f67b0);
    DebuggerPropertyDisplayInfo::DebuggerPropertyDisplayInfo
              (pDVar5,itemObj_local._4_4_,ppMethodsGroupWalker_local,info_1._4_4_);
    local_e8 = pDVar5;
    JsUtil::
    List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this->pMembersList,&local_e8);
  }
  return;
}

Assistant:

void RecyclableObjectWalker::InsertItem(
        PropertyId propertyId,
        bool isConst,
        bool isUnscoped,
        Var itemObj,
        Js:: RecyclableMethodsGroupWalker **ppMethodsGroupWalker,
        bool shouldPinProperty /* = false*/)
    {
        Assert(propertyId);
        Assert(ppMethodsGroupWalker);

        if (itemObj == nullptr)
        {
            itemObj = scriptContext->GetLibrary()->GetUndefined();
        }

        if (shouldPinProperty)
        {
            const Js::PropertyRecord * propertyRecord = scriptContext->GetPropertyName(propertyId);
            if (propertyRecord)
            {
                // Pin this record so that it will not go away till we are done with this break.
                scriptContext->GetDebugContext()->GetProbeContainer()->PinPropertyRecord(propertyRecord);
            }
        }

        ArenaAllocator *arena = GetArenaFromContext(scriptContext);

        if (JavascriptOperators::GetTypeId(itemObj) == TypeIds_Function)
        {
            if (scriptContext->GetThreadContext()->GetDebugManager()->IsLocalsDisplayFlagsSet(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods))
            {
                DebuggerPropertyDisplayInfo *info = Anew(arena, DebuggerPropertyDisplayInfo, propertyId, itemObj, DebuggerPropertyDisplayInfoFlags_Const);
                pMembersList->Add(info);
            }
            else
            {
                EnsureFakeGroupObjectWalkerList();

                if (*ppMethodsGroupWalker == nullptr)
                {
                    *ppMethodsGroupWalker = Anew(arena, RecyclableMethodsGroupWalker, scriptContext, instance);
                    fakeGroupObjectWalkerList->Add(*ppMethodsGroupWalker);
                }

                (*ppMethodsGroupWalker)->AddItem(propertyId, itemObj);
            }
        }
        else
        {
            DWORD flags = DebuggerPropertyDisplayInfoFlags_None;
            flags |= isConst ? DebuggerPropertyDisplayInfoFlags_Const : 0;
            flags |= isUnscoped ? DebuggerPropertyDisplayInfoFlags_Unscope : 0;

            DebuggerPropertyDisplayInfo *info = Anew(arena, DebuggerPropertyDisplayInfo, propertyId, itemObj, flags);

            pMembersList->Add(info);
        }
    }